

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ParseInt32Flag(char *str,char *flag,Int32 *value)

{
  bool bVar1;
  char *str_00;
  size_t sVar2;
  long in_FS_OFFSET;
  Message local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 != (char *)0x0) {
    Message::Message(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_40.ss_.ptr_ + 0x10),"The value of flag --",0x14);
    if (flag == (char *)0x0) {
      sVar2 = 6;
      flag = "(null)";
    }
    else {
      sVar2 = strlen(flag);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_40.ss_.ptr_ + 0x10),flag,sVar2);
    bVar1 = ParseInt32(&local_40,str_00,value);
    if (local_40.ss_.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40.ss_.ptr_ + 8))(local_40.ss_.ptr_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, Int32* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}